

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_string_append_from_wcs(archive_string *as,wchar_t *w,size_t len)

{
  size_t sVar1;
  archive_string *paVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  wchar_t __wc;
  char *__s;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  mbstate_t_conflict shift_state;
  wchar_t local_54;
  mbstate_t local_38;
  
  local_38.__count = 0;
  local_38.__value = (_union_27)0x0;
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  local_54 = L'\xffffffff';
  if (paVar2 != (archive_string *)0x0) {
    pcVar5 = as->s;
    sVar7 = as->buffer_length;
    __s = pcVar5 + as->length;
    sVar3 = __ctype_get_mb_cur_max();
    __wc = *w;
    local_54 = L'\0';
    if (len != 0 && __wc != L'\0') {
      pcVar5 = pcVar5 + ~sVar3 + sVar7;
      lVar6 = len * 2 + 1;
      local_54 = L'\0';
      sVar7 = 1;
      do {
        if (pcVar5 <= __s) {
          as->length = (long)__s - (long)as->s;
          *__s = '\0';
          paVar2 = archive_string_ensure(as,as->length + lVar6);
          if (paVar2 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar5 = as->s;
          __s = pcVar5 + as->length;
          sVar1 = as->buffer_length;
          sVar3 = __ctype_get_mb_cur_max();
          pcVar5 = pcVar5 + ~sVar3 + sVar1;
          __wc = w[sVar7 - 1];
        }
        sVar3 = wcrtomb(__s,__wc,&local_38);
        if ((int)sVar3 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 != 0x54) {
            local_54 = L'\xffffffff';
            break;
          }
          *__s = '?';
          __s = __s + 1;
          local_54 = L'\xffffffff';
        }
        else {
          __s = __s + (int)sVar3;
        }
        __wc = w[sVar7];
        if (__wc == L'\0') break;
        lVar6 = lVar6 + -2;
        bVar8 = len != sVar7;
        sVar7 = sVar7 + 1;
      } while (bVar8);
    }
    as->length = (long)__s - (long)as->s;
    *__s = '\0';
  }
  return local_54;
}

Assistant:

int
archive_string_append_from_wcs(struct archive_string *as,
    const wchar_t *w, size_t len)
{
	/* We cannot use the standard wcstombs() here because it
	 * cannot tell us how big the output buffer should be.  So
	 * I've built a loop around wcrtomb() or wctomb() that
	 * converts a character at a time and resizes the string as
	 * needed.  We prefer wcrtomb() when it's available because
	 * it's thread-safe. */
	int n, ret_val = 0;
	char *p;
	char *end;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while (*w != L'\0' && len > 0) {
		if (p >= end) {
			as->length = p - as->s;
			as->s[as->length] = '\0';
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + len * 2 + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}
#if HAVE_WCRTOMB
		n = wcrtomb(p, *w++, &shift_state);
#else
		n = wctomb(p, *w++);
#endif
		if (n == -1) {
			if (errno == EILSEQ) {
				/* Skip an illegal wide char. */
				*p++ = '?';
				ret_val = -1;
			} else {
				ret_val = -1;
				break;
			}
		} else
			p += n;
		len--;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret_val);
}